

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

void __thiscall asl::XdlEncoder::new_number(XdlEncoder *this,int x)

{
  int i;
  int iVar1;
  char *s;
  int n;
  int x_local;
  XdlEncoder *this_local;
  
  i = asl::String::length(&this->_out);
  asl::String::resize(&this->_out,i + 0xb,true,true);
  s = asl::String::operator[](&this->_out,i);
  iVar1 = myitoa(x,s);
  asl::String::fix(&this->_out,i + iVar1);
  return;
}

Assistant:

void XdlEncoder::new_number(int x)
{
	int n = _out.length();
	_out.resize(n+11);
	_out.fix(n + myitoa(x, &_out[n]));
}